

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O0

int duckdb_brotli::BrotliEncoderSetParameter
              (BrotliEncoderStateInternal *state,BrotliEncoderParameter p,uint32_t value)

{
  uint32_t value_local;
  BrotliEncoderParameter p_local;
  BrotliEncoderStateInternal *state_local;
  int local_4;
  
  if (state->is_initialized_ == 0) {
    switch(p) {
    case BROTLI_PARAM_MODE:
      (state->params).mode = value;
      local_4 = 1;
      break;
    case BROTLI_PARAM_QUALITY:
      (state->params).quality = value;
      local_4 = 1;
      break;
    case BROTLI_PARAM_LGWIN:
      (state->params).lgwin = value;
      local_4 = 1;
      break;
    case BROTLI_PARAM_LGBLOCK:
      (state->params).lgblock = value;
      local_4 = 1;
      break;
    case BROTLI_PARAM_DISABLE_LITERAL_CONTEXT_MODELING:
      if ((value == 0) || (value == 1)) {
        (state->params).disable_literal_context_modeling = (uint)(value != 0);
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
      break;
    case BROTLI_PARAM_SIZE_HINT:
      (state->params).size_hint = (ulong)value;
      local_4 = 1;
      break;
    case BROTLI_PARAM_LARGE_WINDOW:
      (state->params).large_window = (uint)(value != 0);
      local_4 = 1;
      break;
    case BROTLI_PARAM_NPOSTFIX:
      (state->params).dist.distance_postfix_bits = value;
      local_4 = 1;
      break;
    case BROTLI_PARAM_NDIRECT:
      (state->params).dist.num_direct_distance_codes = value;
      local_4 = 1;
      break;
    case BROTLI_PARAM_STREAM_OFFSET:
      if (value < 0x40000001) {
        (state->params).stream_offset = (ulong)value;
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
      break;
    default:
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliEncoderSetParameter(
    BrotliEncoderState* state, BrotliEncoderParameter p, uint32_t value) {
  /* Changing parameters on the fly is not implemented yet. */
  if (state->is_initialized_) return BROTLI_FALSE;
  /* TODO(eustas): Validate/clamp parameters here. */
  switch (p) {
    case BROTLI_PARAM_MODE:
      state->params.mode = (BrotliEncoderMode)value;
      return BROTLI_TRUE;

    case BROTLI_PARAM_QUALITY:
      state->params.quality = (int)value;
      return BROTLI_TRUE;

    case BROTLI_PARAM_LGWIN:
      state->params.lgwin = (int)value;
      return BROTLI_TRUE;

    case BROTLI_PARAM_LGBLOCK:
      state->params.lgblock = (int)value;
      return BROTLI_TRUE;

    case BROTLI_PARAM_DISABLE_LITERAL_CONTEXT_MODELING:
      if ((value != 0) && (value != 1)) return BROTLI_FALSE;
      state->params.disable_literal_context_modeling = TO_BROTLI_BOOL(!!value);
      return BROTLI_TRUE;

    case BROTLI_PARAM_SIZE_HINT:
      state->params.size_hint = value;
      return BROTLI_TRUE;

    case BROTLI_PARAM_LARGE_WINDOW:
      state->params.large_window = TO_BROTLI_BOOL(!!value);
      return BROTLI_TRUE;

    case BROTLI_PARAM_NPOSTFIX:
      state->params.dist.distance_postfix_bits = value;
      return BROTLI_TRUE;

    case BROTLI_PARAM_NDIRECT:
      state->params.dist.num_direct_distance_codes = value;
      return BROTLI_TRUE;

    case BROTLI_PARAM_STREAM_OFFSET:
      if (value > (1u << 30)) return BROTLI_FALSE;
      state->params.stream_offset = value;
      return BROTLI_TRUE;

    default: return BROTLI_FALSE;
  }
}